

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_compound_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  size_t sVar1;
  gtoken_s token_00;
  _Bool _Var2;
  gtoken_t gVar3;
  uint uVar4;
  gnode_r *stmts;
  gnode_t *pgVar5;
  gnode_t **ppgVar6;
  size_t sVar7;
  gtoken_s token;
  gtoken_s end_token;
  undefined8 local_a0;
  undefined4 uStack_98;
  int iStack_94;
  undefined8 local_90;
  undefined8 uStack_88;
  char *local_80;
  int local_6c;
  int local_64;
  
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gravity_lexer_token(lexer);
  stmts = gnode_array_create();
  gVar3 = gravity_lexer_peek(lexer);
  _Var2 = token_isstatement(gVar3);
  if (_Var2) {
    do {
      uVar4 = parser->depth + 1;
      parser->depth = uVar4;
      if (1000 < uVar4) {
        gravity_lexer_token(lexer);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x141b8a);
        return (gnode_t *)0x0;
      }
      pgVar5 = parse_statement(parser);
      if (pgVar5 != (gnode_t *)0x0) {
        sVar1 = stmts->m;
        if (stmts->n == sVar1) {
          sVar7 = sVar1 * 2;
          if (sVar1 == 0) {
            sVar7 = 8;
          }
          stmts->m = sVar7;
          ppgVar6 = (gnode_t **)realloc(stmts->p,sVar7 << 3);
          stmts->p = ppgVar6;
        }
        sVar1 = stmts->n;
        stmts->n = sVar1 + 1;
        stmts->p[sVar1] = pgVar5;
      }
      parser->depth = parser->depth - 1;
      gVar3 = gravity_lexer_peek(lexer);
      _Var2 = token_isstatement(gVar3);
    } while (_Var2);
  }
  parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  gravity_lexer_token(lexer);
  sVar1 = parser->declarations->n;
  if (sVar1 == 0) {
    pgVar5 = (gnode_t *)0x0;
  }
  else {
    pgVar5 = parser->declarations->p[sVar1 - 1];
  }
  token_00.colno = uStack_98;
  token_00._0_8_ = local_a0;
  token_00.position = iStack_94;
  token_00.bytes = (int)local_90;
  token_00.length = (int)((ulong)local_90 >> 0x20);
  token_00.fileid = (int)uStack_88;
  token_00.builtin = (int)((ulong)uStack_88 >> 0x20);
  token_00.value = local_80;
  pgVar5 = gnode_block_stat_create
                     (NODE_COMPOUND_STAT,token_00,stmts,pgVar5,(local_64 + local_6c) - iStack_94);
  return pgVar5;
}

Assistant:

static gnode_t *parse_compound_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_compound_statement");

    // '{' (statement+)? '}'

    // check and consume TOK_OP_OPEN_CURLYBRACE
    parse_required(parser, TOK_OP_OPEN_CURLYBRACE);

    DECLARE_LEXER;
    gtoken_s token = gravity_lexer_token(lexer);
    gnode_r *stmts = gnode_array_create();
    while (token_isstatement(gravity_lexer_peek(lexer))) {
        if (++parser->depth > MAX_RECURSION_DEPTH) {
            REPORT_ERROR(gravity_lexer_token(lexer), "Maximum statement recursion depth reached.");
            return NULL;
        }
        gnode_t *node = parse_statement(parser);
        if (node) gnode_array_push(stmts, node);
        --parser->depth;
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_block_stat_create(NODE_COMPOUND_STAT, token, stmts, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}